

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buf.cc
# Opt level: O0

int BUF_MEM_grow_clean(BUF_MEM *str,size_t len)

{
  int iVar1;
  size_t len_local;
  BUF_MEM *buf_local;
  
  iVar1 = BUF_MEM_grow(str,len);
  return iVar1;
}

Assistant:

size_t BUF_MEM_grow_clean(BUF_MEM *buf, size_t len) {
  return BUF_MEM_grow(buf, len);
}